

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap_reader.cpp
# Opt level: O3

bool __thiscall pcap_reader::ReadNext(pcap_reader *this)

{
  byte bVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint8_t *__ptr;
  byte *pbVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  sVar3 = fread(&this->frame_header,0x10,1,(FILE *)this->F_pcap);
  this->fragment_length = 0;
  this->ip_offset = 0;
  this->ip_version = 0;
  this->tp_length = 0;
  this->tp_offset = 0;
  *(undefined8 *)((long)&this->tp_offset + 1) = 0;
  *(undefined8 *)((long)&this->tp_port1 + 1) = 0;
  if (sVar3 != 1) {
    return false;
  }
  uVar6 = (this->frame_header).incl_len;
  sVar3 = (size_t)uVar6;
  if (this->buffer_size < uVar6) {
    __ptr = (uint8_t *)operator_new__(sVar3);
    uVar7 = uVar6;
    if (this->buffer != (uint8_t *)0x0) {
      operator_delete__(this->buffer);
      uVar7 = (this->frame_header).incl_len;
    }
    this->buffer = __ptr;
    this->buffer_size = uVar6;
    sVar3 = (size_t)uVar7;
  }
  else {
    __ptr = this->buffer;
  }
  sVar3 = fread(__ptr,1,sVar3,(FILE *)this->F_pcap);
  if (sVar3 != (this->frame_header).incl_len) {
    return false;
  }
  uVar2 = (this->header).network;
  if (uVar2 == 0x65) {
    this->ip_offset = 0;
    pbVar4 = this->buffer;
    uVar8 = (uint)(*pbVar4 >> 4);
    this->ip_version = uVar8;
    uVar7 = 0;
    uVar6 = 0;
    if (uVar8 == 6) {
LAB_0019bc55:
      this->tp_offset = uVar7 + 0x28;
      this->tp_version = (uint)pbVar4[(ulong)uVar7 + 6];
      uVar7 = (uint)(ushort)(*(ushort *)(pbVar4 + (ulong)uVar7 + 4) << 8 |
                            *(ushort *)(pbVar4 + (ulong)uVar7 + 4) >> 8);
LAB_0019bc71:
      this->tp_length = uVar7;
      goto LAB_0019bc80;
    }
    if (uVar8 == 4) goto LAB_0019bbe9;
  }
  else {
    if (uVar2 != 1) {
      return true;
    }
    pbVar4 = this->buffer;
    uVar5 = *(ushort *)(pbVar4 + 0xc) << 8 | *(ushort *)(pbVar4 + 0xc) >> 8;
    this->ip_offset = 0xe;
    if (uVar5 == 0x86dd) {
      if ((pbVar4[0xe] & 0xf0) == 0x60) {
        this->ip_version = 6;
        uVar7 = 0xe;
        goto LAB_0019bc55;
      }
    }
    else if ((uVar5 == 0x800) && ((pbVar4[0xe] & 0xf0) == 0x40)) {
      this->ip_version = 4;
      uVar6 = 0xe;
LAB_0019bbe9:
      uVar5 = *(ushort *)(pbVar4 + (ulong)uVar6 + 2);
      bVar1 = pbVar4[(ulong)uVar6 + 6];
      this->is_fragment = (bool)((bVar1 & 0x20) >> 5);
      uVar7 = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
      uVar8 = uVar7;
      if ((bVar1 & 0x20) != 0) {
        uVar8 = (uint)pbVar4[(ulong)uVar6 + 7] | (pbVar4[(ulong)uVar6 + 6] & 0x1f) << 8;
      }
      this->fragment_length = uVar8;
      this->tp_offset = uVar6 + 0x14;
      this->tp_version = (uint)pbVar4[(ulong)uVar6 + 9];
      uVar7 = uVar7 - 0x14;
      goto LAB_0019bc71;
    }
    this->ip_version = -1;
  }
  uVar7 = this->tp_length;
LAB_0019bc80:
  if (uVar7 != 0) {
    this->tp_port1 =
         (uint)(ushort)(*(ushort *)(pbVar4 + this->tp_offset) << 8 |
                       *(ushort *)(pbVar4 + this->tp_offset) >> 8);
    this->tp_port2 =
         (uint)(ushort)(*(ushort *)(pbVar4 + (long)this->tp_offset + 2) << 8 |
                       *(ushort *)(pbVar4 + (long)this->tp_offset + 2) >> 8);
    return true;
  }
  return true;
}

Assistant:

bool pcap_reader::ReadNext()
{
    size_t nb_read = fread(&frame_header, sizeof(frame_header), 1, F_pcap);
    bool ret = nb_read == 1;

    ip_version = 0;
    ip_offset = 0;
    tp_version = 0;
    tp_offset = 0;
    tp_length = 0;
    tp_port1 = 0;
    tp_port2 = 0;
    is_fragment = false;
    fragment_length = 0;

    if (ret)
    {

        if (is_wrong_endian)
        {
            /* TODO: swap the values */
        }

        if (frame_header.incl_len > buffer_size)
        {
            int new_size = frame_header.incl_len;
            uint8_t * new_buf = new uint8_t[frame_header.incl_len];
            if (new_buf == NULL)
            {
                ret = false;
            }
            else
            {
                if (buffer != NULL)
                {
                    delete[] buffer;
                }
                buffer = new_buf;
                buffer_size = new_size;
            }
        }

        if (ret)
        {
            size_t uint8_ts_read = fread(buffer, 1, frame_header.incl_len, F_pcap);
            ret = (uint8_ts_read == frame_header.incl_len);
        }
    }

    if (ret && (header.network == 1 || header.network == 101))
    {
        int ip_length;

        if (header.network == 1)
        {
            /* Ethernet */
            int payload_type = (buffer[12] << 8) | (buffer[13]);

            ip_offset = 14;
            ip_version = payload_type == 0x0800 && buffer[ip_offset] >> 4 == 4 ? 4
                : payload_type == 0x86DD && buffer[ip_offset] >> 4 == 6 ? 6
                : -1;
        }
        else
        {
            /* Raw */
            ip_offset = 0;
            ip_version = buffer[ip_offset] >> 4;
        }
        switch (ip_version)
        {
        case 4:
            /* IPv4 */
            ip_length = (buffer[ip_offset + 2] << 8) | (buffer[ip_offset + 3]);
            is_fragment = ((buffer[ip_offset + 6] & 0x20) != 0);
            fragment_length = (is_fragment) ?
                ((buffer[ip_offset + 6] & 0x1F) << 8) | (buffer[ip_offset + 7]) :
                ip_length;

            tp_offset = ip_offset + 20;
            tp_version = buffer[ip_offset + 9];
            tp_length = ip_length - (tp_offset - ip_offset);
            break;

        case 6:
            /* IPv6, 1 0 0 0 0 1 1 0 1 1 0 1 1 1 0 1 */
            tp_offset = ip_offset + 40;
            tp_version = buffer[ip_offset + 6];
            tp_length = (buffer[ip_offset + 4] << 8) | (buffer[ip_offset + 5]);
            break;
        default:
            break;
        }

        if (tp_length != 0)
        {
            tp_port1 = (buffer[tp_offset] << 8) | (buffer[tp_offset + 1]);
            tp_port2 = (buffer[tp_offset + 2] << 8) | (buffer[tp_offset + 3]);
        }
    }

    return ret;
}